

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Iterator *
leveldb::NewTwoLevelIterator
          (Iterator *index_iter,BlockFunction block_function,void *arg,ReadOptions *options)

{
  TwoLevelIterator *this;
  ReadOptions *options_local;
  void *arg_local;
  BlockFunction block_function_local;
  Iterator *index_iter_local;
  
  this = (TwoLevelIterator *)operator_new(0xb0);
  anon_unknown_7::TwoLevelIterator::TwoLevelIterator(this,index_iter,block_function,arg,options);
  return &this->super_Iterator;
}

Assistant:

Iterator* NewTwoLevelIterator(Iterator* index_iter,
                              BlockFunction block_function, void* arg,
                              const ReadOptions& options) {
  return new TwoLevelIterator(index_iter, block_function, arg, options);
}